

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

int Dtc_ManCompare(int *pCut0,int *pCut1)

{
  int *pCut1_local;
  int *pCut0_local;
  
  if (*pCut0 < *pCut1) {
    pCut0_local._4_4_ = -1;
  }
  else if (*pCut1 < *pCut0) {
    pCut0_local._4_4_ = 1;
  }
  else if (pCut0[1] < pCut1[1]) {
    pCut0_local._4_4_ = -1;
  }
  else if (pCut1[1] < pCut0[1]) {
    pCut0_local._4_4_ = 1;
  }
  else if (pCut0[2] < pCut1[2]) {
    pCut0_local._4_4_ = -1;
  }
  else if (pCut1[2] < pCut0[2]) {
    pCut0_local._4_4_ = 1;
  }
  else {
    pCut0_local._4_4_ = 0;
  }
  return pCut0_local._4_4_;
}

Assistant:

int Dtc_ManCompare( int * pCut0, int * pCut1 )
{
    if ( pCut0[0] < pCut1[0] ) return -1;
    if ( pCut0[0] > pCut1[0] ) return  1;
    if ( pCut0[1] < pCut1[1] ) return -1;
    if ( pCut0[1] > pCut1[1] ) return  1;
    if ( pCut0[2] < pCut1[2] ) return -1;
    if ( pCut0[2] > pCut1[2] ) return  1;
    return 0;
}